

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Own<kj::_::ForkBranch<kj::_::Void,_true>,_kj::_::PromiseDisposer> __thiscall
kj::_::PromiseDisposer::
alloc<kj::_::ForkBranch<kj::_::Void,true>,kj::_::PromiseDisposer,kj::Own<kj::_::ForkHubBase,kj::_::ForkHubBase>>
          (PromiseDisposer *this,Own<kj::_::ForkHubBase,_kj::_::ForkHubBase> *params)

{
  void *pvVar1;
  Own<kj::_::ForkHubBase,_kj::_::ForkHubBase> *params_00;
  PromiseArena *arena;
  ForkBranch<kj::_::Void,_true> *ptr;
  Own<kj::_::ForkHubBase,_kj::_::ForkHubBase> *params_local;
  
  pvVar1 = operator_new(0x400);
  params_00 = fwd<kj::Own<kj::_::ForkHubBase,kj::_::ForkHubBase>>(params);
  ctor<kj::_::ForkBranch<kj::_::Void,true>,kj::Own<kj::_::ForkHubBase,kj::_::ForkHubBase>>
            ((ForkBranch<kj::_::Void,_true> *)((long)pvVar1 + 0x3d0),params_00);
  *(void **)((long)pvVar1 + 0x3d8) = pvVar1;
  Own<kj::_::ForkBranch<kj::_::Void,_true>,_kj::_::PromiseDisposer>::Own
            ((Own<kj::_::ForkBranch<kj::_::Void,_true>,_kj::_::PromiseDisposer> *)this,
             (ForkBranch<kj::_::Void,_true> *)((long)pvVar1 + 0x3d0));
  return (Own<kj::_::ForkBranch<kj::_::Void,_true>,_kj::_::PromiseDisposer>)
         (ForkBranch<kj::_::Void,_true> *)this;
}

Assistant:

static kj::Own<T, D> alloc(Params&&... params) noexcept {
    // Implements allocPromise().
    T* ptr;
    if (!canArenaAllocate<T>()) {
      // Node too big (or needs weird alignment), fall back to regular heap allocation.
      ptr = new T(kj::fwd<Params>(params)...);
    } else {
      // Start a new arena.
      //
      // NOTE: As in appendPromise() (below), we don't implement exception-safety because it causes
      //   code bloat and these constructors probably don't throw. Instead this function is
      //   noexcept, so if a constructor does throw, it'll crash rather than leak memory.
      auto* arena = new PromiseArena;
      ptr = reinterpret_cast<T*>(arena + 1) - 1;
      ctor(*ptr, kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
    }
    return kj::Own<T, D>(ptr);
  }